

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple-test.c++
# Opt level: O0

void __thiscall kj::TestCase35::run(TestCase35 *this)

{
  bool bVar1;
  TypeByIndex<0UL,_kj::Foo,_kj::Bar> *pTVar2;
  TypeByIndex<1UL,_kj::Foo,_kj::Bar> *pTVar3;
  TypeByIndex<0UL,_kj::Foo,_kj::Bar,_kj::Baz,_kj::Qux,_kj::Quux> *pTVar4;
  TypeByIndex<1UL,_kj::Foo,_kj::Bar,_kj::Baz,_kj::Qux,_kj::Quux> *pTVar5;
  TypeByIndex<2UL,_kj::Foo,_kj::Bar,_kj::Baz,_kj::Qux,_kj::Quux> *pTVar6;
  TypeByIndex<3UL,_kj::Foo,_kj::Bar,_kj::Baz,_kj::Qux,_kj::Quux> *pTVar7;
  char *pcVar8;
  TypeByIndex<4UL,_kj::Foo,_kj::Bar,_kj::Baz,_kj::Qux,_kj::Quux> *params_2;
  TypeByIndex<0UL,_kj::Own<kj::Foo>,_kj::Own<kj::Bar>_> *pTVar9;
  Foo *pFVar10;
  TypeByIndex<1UL,_kj::Own<kj::Foo>,_kj::Own<kj::Bar>_> *pTVar11;
  kj *this_00;
  TypeByIndex<0UL,_kj::Own<kj::Foo>,_kj::Own<kj::Bar>,_kj::Own<kj::Baz>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>
  *pTVar12;
  TypeByIndex<1UL,_kj::Own<kj::Foo>,_kj::Own<kj::Bar>,_kj::Own<kj::Baz>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>
  *pTVar13;
  Bar *pBVar14;
  TypeByIndex<2UL,_kj::Own<kj::Foo>,_kj::Own<kj::Bar>,_kj::Own<kj::Baz>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>
  *pTVar15;
  Baz *pBVar16;
  TypeByIndex<3UL,_kj::Own<kj::Foo>,_kj::Own<kj::Bar>,_kj::Own<kj::Baz>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>
  *pTVar17;
  Qux *pQVar18;
  TypeByIndex<4UL,_kj::Own<kj::Foo>,_kj::Own<kj::Bar>,_kj::Own<kj::Baz>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>
  *pTVar19;
  Quux *params_2_00;
  TypeByIndex<0UL,_kj::String,_kj::StringPtr> *pTVar20;
  TypeByIndex<1UL,_kj::String,_kj::StringPtr> *pTVar21;
  TypeByIndex<0UL,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::String> *pTVar22;
  TypeByIndex<1UL,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::String> *pTVar23;
  TypeByIndex<2UL,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::String> *pTVar24;
  TypeByIndex<3UL,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::String> *pTVar25;
  TypeByIndex<4UL,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::String> *pTVar26;
  Tuple<kj::String,_kj::StringPtr> *params_3;
  char *in_R8;
  uint local_3ac;
  bool local_3a7;
  Tuple<> local_3a4 [2];
  Tuple<> local_3a2;
  Tuple<> local_3a1;
  bool _kj_shouldLog_22;
  int iStack_3a0;
  Tuple<> local_399;
  uint local_398;
  bool local_391;
  int local_390;
  uint uStack_38c;
  bool _kj_shouldLog_21;
  int local_388;
  uint i;
  Own<kj::Bar> local_380;
  int local_36c;
  Own<kj::Foo> local_368;
  ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::Own<kj::Foo>,_kj::Own<kj::Bar>_> local_358;
  Type local_336;
  bool local_335;
  bool local_334;
  bool local_333;
  bool local_332;
  bool local_331;
  undefined1 local_330 [3];
  bool _kj_shouldLog_20;
  bool _kj_shouldLog_19;
  bool _kj_shouldLog_18;
  bool _kj_shouldLog_17;
  bool _kj_shouldLog_16;
  ExpandAndApplyResult<kj::_::MakeTupleFunc,_const_char_(&)[4],_kj::String> local_318;
  Tuple<kj::StringPtr,kj::StringPtr> local_2f8 [32];
  ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::StringPtr_&&,_kj::StringPtr_&&,_const_char_(&)[4],_kj::_::Tuple<const_char_*,_kj::String>_>
  local_2d8;
  undefined1 local_290 [8];
  Tuple<StringPtr,_StringPtr,_StringPtr,_StringPtr,_String> t6;
  undefined1 local_230 [6];
  bool _kj_shouldLog_15;
  bool _kj_shouldLog_14;
  ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::String,_const_char_(&)[4]> local_218;
  undefined1 local_1f8 [8];
  Tuple<String,_StringPtr> t5;
  bool local_1c5;
  uint local_1c4;
  bool _kj_shouldLog_13;
  uint local_1bc;
  bool _kj_shouldLog_12;
  uint local_1b4;
  bool _kj_shouldLog_11;
  uint local_1ac;
  bool _kj_shouldLog_10;
  int local_1a4;
  undefined1 local_1a0 [3];
  bool _kj_shouldLog_9;
  int local_18c;
  Own<kj::Qux> local_188;
  ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_> local_178;
  int local_154;
  undefined1 local_150 [24];
  Tuple<Own<Foo>,_Own<Bar>,_Own<Baz>,_Own<Qux>,_Own<Quux>_> t4;
  bool local_e5;
  uint local_e4;
  bool _kj_shouldLog_8;
  bool _kj_shouldLog_7;
  int local_cc;
  Own<kj::Bar> local_c8;
  int local_b4;
  Own<kj::Foo> local_b0;
  undefined1 local_a0 [8];
  Tuple<Own<Foo>,_Own<Bar>_> t3;
  uint local_78;
  bool _kj_shouldLog_6;
  uint local_70;
  bool _kj_shouldLog_5;
  uint local_68;
  bool _kj_shouldLog_4;
  uint local_60;
  bool _kj_shouldLog_3;
  Quux local_58;
  bool _kj_shouldLog_2;
  TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Qux,_kj::Quux> local_50;
  undefined1 local_48 [12];
  Tuple<Foo,_Bar,_Baz,_Qux,_Quux> t2;
  uint local_28;
  bool _kj_shouldLog_1;
  Bar local_20;
  bool _kj_shouldLog;
  TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Foo,_kj::Bar> local_18;
  Tuple<Foo,_Bar> t;
  TestCase35 *this_local;
  
  t.impl = (TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Foo,_kj::Bar>)this;
  Foo::Foo((Foo *)&stack0xffffffffffffffe4,0x7b);
  Bar::Bar(&local_20,0x1c8);
  local_18 = (TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Foo,_kj::Bar>)
             tuple<kj::Foo,kj::Bar>((Foo *)&stack0xffffffffffffffe4,&local_20);
  pTVar2 = get<0ul,kj::_::Tuple<kj::Foo,kj::Bar>&>((Tuple<kj::Foo,_kj::Bar> *)&local_18);
  if (pTVar2->foo != 0x7b) {
    _kj_shouldLog_1 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_1 != false) {
      local_28 = 0x7b;
      pTVar2 = get<0ul,kj::_::Tuple<kj::Foo,kj::Bar>&>((Tuple<kj::Foo,_kj::Bar> *)&local_18);
      in_R8 = "failed: expected (123u) == (get<0>(t).foo)";
      _::Debug::log<char_const(&)[43],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x25,ERROR,
                 "\"failed: expected \" \"(123u) == (get<0>(t).foo)\", 123u, get<0>(t).foo",
                 (char (*) [43])"failed: expected (123u) == (get<0>(t).foo)",&local_28,&pTVar2->foo)
      ;
      _kj_shouldLog_1 = false;
    }
  }
  pTVar3 = get<1ul,kj::_::Tuple<kj::Foo,kj::Bar>&>((Tuple<kj::Foo,_kj::Bar> *)&local_18);
  if (pTVar3->bar != 0x1c8) {
    t2.impl.super_TupleElement<4U,_kj::Quux>.value.quux._3_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)t2.impl.super_TupleElement<4U,_kj::Quux>.value.quux._3_1_ != false) {
      t2.impl.super_TupleElement<3U,_kj::Qux>.value.qux = (Qux)0x1c8;
      pTVar3 = get<1ul,kj::_::Tuple<kj::Foo,kj::Bar>&>((Tuple<kj::Foo,_kj::Bar> *)&local_18);
      in_R8 = "failed: expected (456u) == (get<1>(t).bar)";
      _::Debug::log<char_const(&)[43],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x26,ERROR,
                 "\"failed: expected \" \"(456u) == (get<1>(t).bar)\", 456u, get<1>(t).bar",
                 (char (*) [43])"failed: expected (456u) == (get<1>(t).bar)",
                 (uint *)&t2.impl.super_TupleElement<3U,_kj::Qux>,&pTVar3->bar);
      t2.impl.super_TupleElement<4U,_kj::Quux>.value.quux._3_1_ = false;
    }
  }
  Baz::Baz((Baz *)local_48,0x315);
  Qux::Qux((Qux *)&stack0xffffffffffffffac,0x141);
  Quux::Quux(&local_58,0x28e);
  local_50 = (TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Qux,_kj::Quux>)
             tuple<kj::Qux,kj::Quux>((Qux *)&stack0xffffffffffffffac,&local_58);
  tuple<kj::_::Tuple<kj::Foo,kj::Bar>&,kj::Baz,kj::_::Tuple<kj::Qux,kj::Quux>>
            ((ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::Foo,_kj::Bar,_kj::Baz,_kj::_::Tuple<kj::Qux,_kj::Quux>_>
              *)(local_48 + 4),(kj *)&local_18,(Tuple<kj::Foo,_kj::Bar> *)local_48,(Baz *)&local_50,
             (Tuple<kj::Qux,_kj::Quux> *)in_R8);
  pTVar4 = get<0ul,kj::_::Tuple<kj::Foo,kj::Bar,kj::Baz,kj::Qux,kj::Quux>&>
                     ((Tuple<kj::Foo,_kj::Bar,_kj::Baz,_kj::Qux,_kj::Quux> *)(local_48 + 4));
  if (pTVar4->foo != 0x7b) {
    _kj_shouldLog_3 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_3 != false) {
      local_60 = 0x7b;
      pTVar4 = get<0ul,kj::_::Tuple<kj::Foo,kj::Bar,kj::Baz,kj::Qux,kj::Quux>&>
                         ((Tuple<kj::Foo,_kj::Bar,_kj::Baz,_kj::Qux,_kj::Quux> *)(local_48 + 4));
      in_R8 = "failed: expected (123u) == (get<0>(t2).foo)";
      _::Debug::log<char_const(&)[44],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x29,ERROR,
                 "\"failed: expected \" \"(123u) == (get<0>(t2).foo)\", 123u, get<0>(t2).foo",
                 (char (*) [44])"failed: expected (123u) == (get<0>(t2).foo)",&local_60,&pTVar4->foo
                );
      _kj_shouldLog_3 = false;
    }
  }
  pTVar5 = get<1ul,kj::_::Tuple<kj::Foo,kj::Bar,kj::Baz,kj::Qux,kj::Quux>&>
                     ((Tuple<kj::Foo,_kj::Bar,_kj::Baz,_kj::Qux,_kj::Quux> *)(local_48 + 4));
  if (pTVar5->bar != 0x1c8) {
    _kj_shouldLog_4 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_4 != false) {
      local_68 = 0x1c8;
      pTVar5 = get<1ul,kj::_::Tuple<kj::Foo,kj::Bar,kj::Baz,kj::Qux,kj::Quux>&>
                         ((Tuple<kj::Foo,_kj::Bar,_kj::Baz,_kj::Qux,_kj::Quux> *)(local_48 + 4));
      in_R8 = "failed: expected (456u) == (get<1>(t2).bar)";
      _::Debug::log<char_const(&)[44],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x2a,ERROR,
                 "\"failed: expected \" \"(456u) == (get<1>(t2).bar)\", 456u, get<1>(t2).bar",
                 (char (*) [44])"failed: expected (456u) == (get<1>(t2).bar)",&local_68,&pTVar5->bar
                );
      _kj_shouldLog_4 = false;
    }
  }
  pTVar6 = get<2ul,kj::_::Tuple<kj::Foo,kj::Bar,kj::Baz,kj::Qux,kj::Quux>&>
                     ((Tuple<kj::Foo,_kj::Bar,_kj::Baz,_kj::Qux,_kj::Quux> *)(local_48 + 4));
  if (pTVar6->baz != 0x315) {
    _kj_shouldLog_5 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_5 != false) {
      local_70 = 0x315;
      pTVar6 = get<2ul,kj::_::Tuple<kj::Foo,kj::Bar,kj::Baz,kj::Qux,kj::Quux>&>
                         ((Tuple<kj::Foo,_kj::Bar,_kj::Baz,_kj::Qux,_kj::Quux> *)(local_48 + 4));
      in_R8 = "failed: expected (789u) == (get<2>(t2).baz)";
      _::Debug::log<char_const(&)[44],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x2b,ERROR,
                 "\"failed: expected \" \"(789u) == (get<2>(t2).baz)\", 789u, get<2>(t2).baz",
                 (char (*) [44])"failed: expected (789u) == (get<2>(t2).baz)",&local_70,&pTVar6->baz
                );
      _kj_shouldLog_5 = false;
    }
  }
  pTVar7 = get<3ul,kj::_::Tuple<kj::Foo,kj::Bar,kj::Baz,kj::Qux,kj::Quux>&>
                     ((Tuple<kj::Foo,_kj::Bar,_kj::Baz,_kj::Qux,_kj::Quux> *)(local_48 + 4));
  if (pTVar7->qux != 0x141) {
    _kj_shouldLog_6 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_6 != false) {
      local_78 = 0x141;
      pTVar7 = get<3ul,kj::_::Tuple<kj::Foo,kj::Bar,kj::Baz,kj::Qux,kj::Quux>&>
                         ((Tuple<kj::Foo,_kj::Bar,_kj::Baz,_kj::Qux,_kj::Quux> *)(local_48 + 4));
      in_R8 = "failed: expected (321u) == (get<3>(t2).qux)";
      _::Debug::log<char_const(&)[44],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x2c,ERROR,
                 "\"failed: expected \" \"(321u) == (get<3>(t2).qux)\", 321u, get<3>(t2).qux",
                 (char (*) [44])"failed: expected (321u) == (get<3>(t2).qux)",&local_78,&pTVar7->qux
                );
      _kj_shouldLog_6 = false;
    }
  }
  pcVar8 = (char *)get<4ul,kj::_::Tuple<kj::Foo,kj::Bar,kj::Baz,kj::Qux,kj::Quux>&>
                             ((Tuple<kj::Foo,_kj::Bar,_kj::Baz,_kj::Qux,_kj::Quux> *)(local_48 + 4))
  ;
  if (*(uint *)&((Own<kj::Bar> *)pcVar8)->disposer != 0x28e) {
    t3.impl.super_TupleElement<1U,_kj::Own<kj::Bar>_>.value.ptr._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)t3.impl.super_TupleElement<1U,_kj::Own<kj::Bar>_>.value.ptr._7_1_ != false) {
      t3.impl.super_TupleElement<1U,_kj::Own<kj::Bar>_>.value.ptr._0_4_ = 0x28e;
      params_2 = get<4ul,kj::_::Tuple<kj::Foo,kj::Bar,kj::Baz,kj::Qux,kj::Quux>&>
                           ((Tuple<kj::Foo,_kj::Bar,_kj::Baz,_kj::Qux,_kj::Quux> *)(local_48 + 4));
      pcVar8 = "\"failed: expected \" \"(654u) == (get<4>(t2).quux)\", 654u, get<4>(t2).quux";
      in_R8 = "failed: expected (654u) == (get<4>(t2).quux)";
      _::Debug::log<char_const(&)[45],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x2d,ERROR,
                 "\"failed: expected \" \"(654u) == (get<4>(t2).quux)\", 654u, get<4>(t2).quux",
                 (char (*) [45])"failed: expected (654u) == (get<4>(t2).quux)",
                 (uint *)&t3.impl.super_TupleElement<1U,_kj::Own<kj::Bar>_>.value.ptr,
                 &params_2->quux);
      t3.impl.super_TupleElement<1U,_kj::Own<kj::Bar>_>.value.ptr._7_1_ = false;
    }
  }
  local_b4 = 0x7b;
  heap<kj::Foo,int>((kj *)&local_b0,&local_b4);
  local_cc = 0x1c8;
  heap<kj::Bar,int>((kj *)&local_c8,&local_cc);
  tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>>
            ((ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::Own<kj::Foo>,_kj::Own<kj::Bar>_> *)
             local_a0,(kj *)&local_b0,(Own<kj::Foo> *)&local_c8,(Own<kj::Bar> *)pcVar8);
  Own<kj::Bar>::~Own(&local_c8);
  Own<kj::Foo>::~Own(&local_b0);
  pTVar9 = get<0ul,kj::_::Tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>>&>
                     ((Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>_> *)local_a0);
  pFVar10 = Own<kj::Foo>::operator->(pTVar9);
  if (pFVar10->foo != 0x7b) {
    _kj_shouldLog_8 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_8 != false) {
      local_e4 = 0x7b;
      pTVar9 = get<0ul,kj::_::Tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>>&>
                         ((Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>_> *)local_a0);
      pFVar10 = Own<kj::Foo>::operator->(pTVar9);
      in_R8 = "failed: expected (123u) == (get<0>(t3)->foo)";
      _::Debug::log<char_const(&)[45],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x30,ERROR,
                 "\"failed: expected \" \"(123u) == (get<0>(t3)->foo)\", 123u, get<0>(t3)->foo",
                 (char (*) [45])"failed: expected (123u) == (get<0>(t3)->foo)",&local_e4,
                 &pFVar10->foo);
      _kj_shouldLog_8 = false;
    }
  }
  pTVar11 = get<1ul,kj::_::Tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>>&>
                      ((Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>_> *)local_a0);
  pcVar8 = (char *)Own<kj::Bar>::operator->(pTVar11);
  if (*(uint *)&((Own<kj::Quux> *)pcVar8)->disposer != 0x1c8) {
    local_e5 = _::Debug::shouldLog(ERROR);
    while (local_e5 != false) {
      t4.impl.super_TupleElement<4U,_kj::Own<kj::Quux>_>.value.ptr._4_4_ = 0x1c8;
      pTVar11 = get<1ul,kj::_::Tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>>&>
                          ((Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>_> *)local_a0);
      pBVar14 = Own<kj::Bar>::operator->(pTVar11);
      pcVar8 = "\"failed: expected \" \"(456u) == (get<1>(t3)->bar)\", 456u, get<1>(t3)->bar";
      in_R8 = "failed: expected (456u) == (get<1>(t3)->bar)";
      _::Debug::log<char_const(&)[45],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x31,ERROR,
                 "\"failed: expected \" \"(456u) == (get<1>(t3)->bar)\", 456u, get<1>(t3)->bar",
                 (char (*) [45])"failed: expected (456u) == (get<1>(t3)->bar)",
                 (uint *)((long)&t4.impl.super_TupleElement<4U,_kj::Own<kj::Quux>_>.value.ptr + 4),
                 &pBVar14->bar);
      local_e5 = false;
    }
  }
  this_00 = (kj *)mv<kj::_::Tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>>>
                            ((Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>_> *)local_a0);
  local_154 = 0x315;
  heap<kj::Baz,int>((kj *)local_150,&local_154);
  local_18c = 0x141;
  heap<kj::Qux,int>((kj *)&local_188,&local_18c);
  local_1a4 = 0x28e;
  heap<kj::Quux,int>((kj *)local_1a0,&local_1a4);
  tuple<kj::Own<kj::Qux>,kj::Own<kj::Quux>>
            (&local_178,(kj *)&local_188,(Own<kj::Qux> *)local_1a0,(Own<kj::Quux> *)pcVar8);
  tuple<kj::_::Tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>>,kj::Own<kj::Baz>,kj::_::Tuple<kj::Own<kj::Qux>,kj::Own<kj::Quux>>>
            ((ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::Own<kj::Foo>_&&,_kj::Own<kj::Bar>_&&,_kj::Own<kj::Baz>,_kj::_::Tuple<kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>_>
              *)(local_150 + 0x10),this_00,(Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>_> *)local_150,
             (Own<kj::Baz> *)&local_178,(Tuple<kj::Own<kj::Qux>,_kj::Own<kj::Quux>_> *)in_R8);
  _::Tuple<kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>::~Tuple(&local_178);
  Own<kj::Quux>::~Own((Own<kj::Quux> *)local_1a0);
  Own<kj::Qux>::~Own(&local_188);
  Own<kj::Baz>::~Own((Own<kj::Baz> *)local_150);
  pTVar12 = get<0ul,kj::_::Tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>,kj::Own<kj::Baz>,kj::Own<kj::Qux>,kj::Own<kj::Quux>>&>
                      ((Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>,_kj::Own<kj::Baz>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>
                        *)(local_150 + 0x10));
  pFVar10 = Own<kj::Foo>::operator->(pTVar12);
  if (pFVar10->foo != 0x7b) {
    _kj_shouldLog_10 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_10 != false) {
      local_1ac = 0x7b;
      pTVar12 = get<0ul,kj::_::Tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>,kj::Own<kj::Baz>,kj::Own<kj::Qux>,kj::Own<kj::Quux>>&>
                          ((Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>,_kj::Own<kj::Baz>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>
                            *)(local_150 + 0x10));
      pFVar10 = Own<kj::Foo>::operator->(pTVar12);
      in_R8 = "failed: expected (123u) == (get<0>(t4)->foo)";
      _::Debug::log<char_const(&)[45],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x35,ERROR,
                 "\"failed: expected \" \"(123u) == (get<0>(t4)->foo)\", 123u, get<0>(t4)->foo",
                 (char (*) [45])"failed: expected (123u) == (get<0>(t4)->foo)",&local_1ac,
                 &pFVar10->foo);
      _kj_shouldLog_10 = false;
    }
  }
  pTVar13 = get<1ul,kj::_::Tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>,kj::Own<kj::Baz>,kj::Own<kj::Qux>,kj::Own<kj::Quux>>&>
                      ((Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>,_kj::Own<kj::Baz>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>
                        *)(local_150 + 0x10));
  pBVar14 = Own<kj::Bar>::operator->(pTVar13);
  if (pBVar14->bar != 0x1c8) {
    _kj_shouldLog_11 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_11 != false) {
      local_1b4 = 0x1c8;
      pTVar13 = get<1ul,kj::_::Tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>,kj::Own<kj::Baz>,kj::Own<kj::Qux>,kj::Own<kj::Quux>>&>
                          ((Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>,_kj::Own<kj::Baz>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>
                            *)(local_150 + 0x10));
      pBVar14 = Own<kj::Bar>::operator->(pTVar13);
      in_R8 = "failed: expected (456u) == (get<1>(t4)->bar)";
      _::Debug::log<char_const(&)[45],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x36,ERROR,
                 "\"failed: expected \" \"(456u) == (get<1>(t4)->bar)\", 456u, get<1>(t4)->bar",
                 (char (*) [45])"failed: expected (456u) == (get<1>(t4)->bar)",&local_1b4,
                 &pBVar14->bar);
      _kj_shouldLog_11 = false;
    }
  }
  pTVar15 = get<2ul,kj::_::Tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>,kj::Own<kj::Baz>,kj::Own<kj::Qux>,kj::Own<kj::Quux>>&>
                      ((Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>,_kj::Own<kj::Baz>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>
                        *)(local_150 + 0x10));
  pBVar16 = Own<kj::Baz>::operator->(pTVar15);
  if (pBVar16->baz != 0x315) {
    _kj_shouldLog_12 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_12 != false) {
      local_1bc = 0x315;
      pTVar15 = get<2ul,kj::_::Tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>,kj::Own<kj::Baz>,kj::Own<kj::Qux>,kj::Own<kj::Quux>>&>
                          ((Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>,_kj::Own<kj::Baz>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>
                            *)(local_150 + 0x10));
      pBVar16 = Own<kj::Baz>::operator->(pTVar15);
      in_R8 = "failed: expected (789u) == (get<2>(t4)->baz)";
      _::Debug::log<char_const(&)[45],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x37,ERROR,
                 "\"failed: expected \" \"(789u) == (get<2>(t4)->baz)\", 789u, get<2>(t4)->baz",
                 (char (*) [45])"failed: expected (789u) == (get<2>(t4)->baz)",&local_1bc,
                 &pBVar16->baz);
      _kj_shouldLog_12 = false;
    }
  }
  pTVar17 = get<3ul,kj::_::Tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>,kj::Own<kj::Baz>,kj::Own<kj::Qux>,kj::Own<kj::Quux>>&>
                      ((Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>,_kj::Own<kj::Baz>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>
                        *)(local_150 + 0x10));
  pQVar18 = Own<kj::Qux>::operator->(pTVar17);
  if (pQVar18->qux != 0x141) {
    _kj_shouldLog_13 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_13 != false) {
      local_1c4 = 0x141;
      pTVar17 = get<3ul,kj::_::Tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>,kj::Own<kj::Baz>,kj::Own<kj::Qux>,kj::Own<kj::Quux>>&>
                          ((Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>,_kj::Own<kj::Baz>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>
                            *)(local_150 + 0x10));
      pQVar18 = Own<kj::Qux>::operator->(pTVar17);
      in_R8 = "failed: expected (321u) == (get<3>(t4)->qux)";
      _::Debug::log<char_const(&)[45],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x38,ERROR,
                 "\"failed: expected \" \"(321u) == (get<3>(t4)->qux)\", 321u, get<3>(t4)->qux",
                 (char (*) [45])"failed: expected (321u) == (get<3>(t4)->qux)",&local_1c4,
                 &pQVar18->qux);
      _kj_shouldLog_13 = false;
    }
  }
  pTVar19 = get<4ul,kj::_::Tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>,kj::Own<kj::Baz>,kj::Own<kj::Qux>,kj::Own<kj::Quux>>&>
                      ((Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>,_kj::Own<kj::Baz>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>
                        *)(local_150 + 0x10));
  pcVar8 = (char *)Own<kj::Quux>::operator->(pTVar19);
  if (*(uint *)&(((String *)pcVar8)->content).ptr != 0x28e) {
    local_1c5 = _::Debug::shouldLog(ERROR);
    while (local_1c5 != false) {
      t5.impl.super_TupleElement<1U,_kj::StringPtr>.value.content.size_._4_4_ = 0x28e;
      pTVar19 = get<4ul,kj::_::Tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>,kj::Own<kj::Baz>,kj::Own<kj::Qux>,kj::Own<kj::Quux>>&>
                          ((Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>,_kj::Own<kj::Baz>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>
                            *)(local_150 + 0x10));
      params_2_00 = Own<kj::Quux>::operator->(pTVar19);
      pcVar8 = "\"failed: expected \" \"(654u) == (get<4>(t4)->quux)\", 654u, get<4>(t4)->quux";
      in_R8 = "failed: expected (654u) == (get<4>(t4)->quux)";
      _::Debug::log<char_const(&)[46],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x39,ERROR,
                 "\"failed: expected \" \"(654u) == (get<4>(t4)->quux)\", 654u, get<4>(t4)->quux",
                 (char (*) [46])"failed: expected (654u) == (get<4>(t4)->quux)",
                 (uint *)((long)&t5.impl.super_TupleElement<1U,_kj::StringPtr>.value.content.size_ +
                         4),&params_2_00->quux);
      local_1c5 = false;
    }
  }
  heapString((String *)local_230,"foo");
  tuple<kj::String,char_const(&)[4]>
            (&local_218,(kj *)local_230,(String *)0x635ef5,(char (*) [4])pcVar8);
  _::Tuple<kj::String,kj::StringPtr>::Tuple<kj::String,char_const*>
            ((Tuple<kj::String,kj::StringPtr> *)local_1f8,&local_218);
  _::Tuple<kj::String,_const_char_*>::~Tuple(&local_218);
  String::~String((String *)local_230);
  pTVar20 = get<0ul,kj::_::Tuple<kj::String,kj::StringPtr>&>
                      ((Tuple<kj::String,_kj::StringPtr> *)local_1f8);
  bVar1 = kj::operator==("foo",pTVar20);
  if (!bVar1) {
    t6.impl.super_TupleElement<4U,_kj::String>.value.content.disposer._7_1_ =
         _::Debug::shouldLog(ERROR);
    while ((bool)t6.impl.super_TupleElement<4U,_kj::String>.value.content.disposer._7_1_ != false) {
      pTVar20 = get<0ul,kj::_::Tuple<kj::String,kj::StringPtr>&>
                          ((Tuple<kj::String,_kj::StringPtr> *)local_1f8);
      pcVar8 = "\"failed: expected \" \"(\\\"foo\\\") == (get<0>(t5))\", \"foo\", get<0>(t5)";
      in_R8 = "failed: expected (\"foo\") == (get<0>(t5))";
      _::Debug::log<char_const(&)[41],char_const(&)[4],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x3c,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (get<0>(t5))\", \"foo\", get<0>(t5)",
                 (char (*) [41])"failed: expected (\"foo\") == (get<0>(t5))",(char (*) [4])0x654402,
                 pTVar20);
      t6.impl.super_TupleElement<4U,_kj::String>.value.content.disposer._7_1_ = false;
    }
  }
  pTVar21 = get<1ul,kj::_::Tuple<kj::String,kj::StringPtr>&>
                      ((Tuple<kj::String,_kj::StringPtr> *)local_1f8);
  bVar1 = kj::operator==("bar",pTVar21);
  if (!bVar1) {
    t6.impl.super_TupleElement<4U,_kj::String>.value.content.disposer._6_1_ =
         _::Debug::shouldLog(ERROR);
    while ((bool)t6.impl.super_TupleElement<4U,_kj::String>.value.content.disposer._6_1_ != false) {
      pTVar21 = get<1ul,kj::_::Tuple<kj::String,kj::StringPtr>&>
                          ((Tuple<kj::String,_kj::StringPtr> *)local_1f8);
      pcVar8 = "\"failed: expected \" \"(\\\"bar\\\") == (get<1>(t5))\", \"bar\", get<1>(t5)";
      in_R8 = "failed: expected (\"bar\") == (get<1>(t5))";
      _::Debug::log<char_const(&)[41],char_const(&)[4],kj::StringPtr&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x3d,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (get<1>(t5))\", \"bar\", get<1>(t5)",
                 (char (*) [41])"failed: expected (\"bar\") == (get<1>(t5))",(char (*) [4])0x635ef5,
                 pTVar21);
      t6.impl.super_TupleElement<4U,_kj::String>.value.content.disposer._6_1_ = false;
    }
  }
  _::Tuple<kj::StringPtr,kj::StringPtr>::Tuple<kj::String,kj::StringPtr>
            (local_2f8,(Tuple<kj::String,_kj::StringPtr> *)local_1f8);
  heapString((String *)local_330,"quux");
  tuple<char_const(&)[4],kj::String>
            (&local_318,(kj *)0x631e26,(char (*) [4])local_330,(String *)pcVar8);
  pcVar8 = (char *)&local_318;
  tuple<kj::_::Tuple<kj::StringPtr,kj::StringPtr>,char_const(&)[4],kj::_::Tuple<char_const*,kj::String>>
            (&local_2d8,(kj *)local_2f8,(Tuple<kj::StringPtr,_kj::StringPtr> *)0x62a7d5,
             (char (*) [4])pcVar8,(Tuple<const_char_*,_kj::String> *)in_R8);
  _::Tuple<kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::String>::
  Tuple<kj::StringPtr,kj::StringPtr,char_const*,char_const*,kj::String>
            ((Tuple<kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::String> *)local_290,
             &local_2d8);
  _::Tuple<kj::StringPtr,_kj::StringPtr,_const_char_*,_const_char_*,_kj::String>::~Tuple(&local_2d8)
  ;
  _::Tuple<const_char_*,_kj::String>::~Tuple(&local_318);
  String::~String((String *)local_330);
  pTVar22 = get<0ul,kj::_::Tuple<kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::String>&>
                      ((Tuple<kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::String>
                        *)local_290);
  bVar1 = kj::operator==("foo",pTVar22);
  if (!bVar1) {
    local_331 = _::Debug::shouldLog(ERROR);
    while (local_331 != false) {
      pTVar22 = get<0ul,kj::_::Tuple<kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::String>&>
                          ((Tuple<kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::String>
                            *)local_290);
      pcVar8 = "\"failed: expected \" \"(\\\"foo\\\") == (get<0>(t6))\", \"foo\", get<0>(t6)";
      _::Debug::log<char_const(&)[41],char_const(&)[4],kj::StringPtr&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x41,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (get<0>(t6))\", \"foo\", get<0>(t6)",
                 (char (*) [41])"failed: expected (\"foo\") == (get<0>(t6))",(char (*) [4])0x654402,
                 pTVar22);
      local_331 = false;
    }
  }
  pTVar23 = get<1ul,kj::_::Tuple<kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::String>&>
                      ((Tuple<kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::String>
                        *)local_290);
  bVar1 = kj::operator==("bar",pTVar23);
  if (!bVar1) {
    local_332 = _::Debug::shouldLog(ERROR);
    while (local_332 != false) {
      pTVar23 = get<1ul,kj::_::Tuple<kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::String>&>
                          ((Tuple<kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::String>
                            *)local_290);
      pcVar8 = "\"failed: expected \" \"(\\\"bar\\\") == (get<1>(t6))\", \"bar\", get<1>(t6)";
      _::Debug::log<char_const(&)[41],char_const(&)[4],kj::StringPtr&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x42,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (get<1>(t6))\", \"bar\", get<1>(t6)",
                 (char (*) [41])"failed: expected (\"bar\") == (get<1>(t6))",(char (*) [4])0x635ef5,
                 pTVar23);
      local_332 = false;
    }
  }
  pTVar24 = get<2ul,kj::_::Tuple<kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::String>&>
                      ((Tuple<kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::String>
                        *)local_290);
  bVar1 = kj::operator==("baz",pTVar24);
  if (!bVar1) {
    local_333 = _::Debug::shouldLog(ERROR);
    while (local_333 != false) {
      pTVar24 = get<2ul,kj::_::Tuple<kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::String>&>
                          ((Tuple<kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::String>
                            *)local_290);
      pcVar8 = "\"failed: expected \" \"(\\\"baz\\\") == (get<2>(t6))\", \"baz\", get<2>(t6)";
      _::Debug::log<char_const(&)[41],char_const(&)[4],kj::StringPtr&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x43,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (get<2>(t6))\", \"baz\", get<2>(t6)",
                 (char (*) [41])"failed: expected (\"baz\") == (get<2>(t6))",(char (*) [4])0x62a7d5,
                 pTVar24);
      local_333 = false;
    }
  }
  pTVar25 = get<3ul,kj::_::Tuple<kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::String>&>
                      ((Tuple<kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::String>
                        *)local_290);
  bVar1 = kj::operator==("qux",pTVar25);
  if (!bVar1) {
    local_334 = _::Debug::shouldLog(ERROR);
    while (local_334 != false) {
      pTVar25 = get<3ul,kj::_::Tuple<kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::String>&>
                          ((Tuple<kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::String>
                            *)local_290);
      pcVar8 = "\"failed: expected \" \"(\\\"qux\\\") == (get<3>(t6))\", \"qux\", get<3>(t6)";
      _::Debug::log<char_const(&)[41],char_const(&)[4],kj::StringPtr&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x44,ERROR,
                 "\"failed: expected \" \"(\\\"qux\\\") == (get<3>(t6))\", \"qux\", get<3>(t6)",
                 (char (*) [41])"failed: expected (\"qux\") == (get<3>(t6))",(char (*) [4])0x631e26,
                 pTVar25);
      local_334 = false;
    }
  }
  pTVar26 = get<4ul,kj::_::Tuple<kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::String>&>
                      ((Tuple<kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::String>
                        *)local_290);
  bVar1 = kj::operator==("quux",pTVar26);
  if (!bVar1) {
    local_335 = _::Debug::shouldLog(ERROR);
    while (local_335 != false) {
      pTVar26 = get<4ul,kj::_::Tuple<kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::String>&>
                          ((Tuple<kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::String>
                            *)local_290);
      pcVar8 = "\"failed: expected \" \"(\\\"quux\\\") == (get<4>(t6))\", \"quux\", get<4>(t6)";
      _::Debug::log<char_const(&)[42],char_const(&)[5],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x45,ERROR,
                 "\"failed: expected \" \"(\\\"quux\\\") == (get<4>(t6))\", \"quux\", get<4>(t6)",
                 (char (*) [42])"failed: expected (\"quux\") == (get<4>(t6))",(char (*) [5])0x635f4f
                 ,pTVar26);
      local_335 = false;
    }
  }
  local_36c = 0x7b;
  heap<kj::Foo,int>((kj *)&local_368,&local_36c);
  i = 0x1c8;
  heap<kj::Bar,int>((kj *)&local_380,(int *)&i);
  tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>>
            (&local_358,(kj *)&local_368,(Own<kj::Foo> *)&local_380,(Own<kj::Bar> *)pcVar8);
  local_388 = 0x315;
  params_3 = mv<kj::_::Tuple<kj::String,kj::StringPtr>>
                       ((Tuple<kj::String,_kj::StringPtr> *)local_1f8);
  apply<kj::TestCase35::run()::__0,kj::_::Tuple<kj::Foo,kj::Bar>&,kj::_::Tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>>,int,kj::_::Tuple<kj::String,kj::StringPtr>>
            (&local_336,(Tuple<kj::Foo,_kj::Bar> *)&local_18,&local_358,&local_388,params_3);
  _::Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>_>::~Tuple(&local_358);
  Own<kj::Bar>::~Own(&local_380);
  Own<kj::Foo>::~Own(&local_368);
  local_390 = 0x7b;
  uStack_38c = tuple<int>(&local_390);
  if (uStack_38c != 0x7b) {
    local_391 = _::Debug::shouldLog(ERROR);
    while (local_391 != false) {
      local_398 = 0x7b;
      _::Debug::log<char_const(&)[31],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x52,ERROR,"\"failed: expected \" \"(123u) == (i)\", 123u, i",
                 (char (*) [31])"failed: expected (123u) == (i)",&local_398,&stack0xfffffffffffffc74
                );
      local_391 = false;
    }
  }
  tuple<>();
  iStack_3a0 = 0x1c8;
  tuple<>();
  tuple<>();
  tuple<kj::_::Tuple<>,kj::_::Tuple<>>(&local_3a2,local_3a4);
  uStack_38c = tuple<kj::_::Tuple<>,int,kj::_::Tuple<>>
                         (&local_399,&stack0xfffffffffffffc60,&local_3a1);
  if (uStack_38c != 0x1c8) {
    local_3a7 = _::Debug::shouldLog(ERROR);
    while (local_3a7 != false) {
      local_3ac = 0x1c8;
      _::Debug::log<char_const(&)[31],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x55,ERROR,"\"failed: expected \" \"(456u) == (i)\", 456u, i",
                 (char (*) [31])"failed: expected (456u) == (i)",&local_3ac,&stack0xfffffffffffffc74
                );
      local_3a7 = false;
    }
  }
  _::Tuple<kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::String>::~Tuple
            ((Tuple<kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::StringPtr,_kj::String> *)
             local_290);
  _::Tuple<kj::String,_kj::StringPtr>::~Tuple((Tuple<kj::String,_kj::StringPtr> *)local_1f8);
  _::
  Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>,_kj::Own<kj::Baz>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>
  ::~Tuple((Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>,_kj::Own<kj::Baz>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>
            *)(local_150 + 0x10));
  _::Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>_>::~Tuple
            ((Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>_> *)local_a0);
  return;
}

Assistant:

TEST(Tuple, Tuple) {
  Tuple<Foo, Bar> t = tuple(Foo(123), Bar(456));
  EXPECT_EQ(123u, get<0>(t).foo);
  EXPECT_EQ(456u, get<1>(t).bar);

  Tuple<Foo, Bar, Baz, Qux, Quux> t2 = tuple(t, Baz(789), tuple(Qux(321), Quux(654)));
  EXPECT_EQ(123u, get<0>(t2).foo);
  EXPECT_EQ(456u, get<1>(t2).bar);
  EXPECT_EQ(789u, get<2>(t2).baz);
  EXPECT_EQ(321u, get<3>(t2).qux);
  EXPECT_EQ(654u, get<4>(t2).quux);

  Tuple<Own<Foo>, Own<Bar>> t3 = tuple(heap<Foo>(123), heap<Bar>(456));
  EXPECT_EQ(123u, get<0>(t3)->foo);
  EXPECT_EQ(456u, get<1>(t3)->bar);

  Tuple<Own<Foo>, Own<Bar>, Own<Baz>, Own<Qux>, Own<Quux>> t4 =
      tuple(mv(t3), heap<Baz>(789), tuple(heap<Qux>(321), heap<Quux>(654)));
  EXPECT_EQ(123u, get<0>(t4)->foo);
  EXPECT_EQ(456u, get<1>(t4)->bar);
  EXPECT_EQ(789u, get<2>(t4)->baz);
  EXPECT_EQ(321u, get<3>(t4)->qux);
  EXPECT_EQ(654u, get<4>(t4)->quux);

  Tuple<String, StringPtr> t5 = tuple(heapString("foo"), "bar");
  EXPECT_EQ("foo", get<0>(t5));
  EXPECT_EQ("bar", get<1>(t5));

  Tuple<StringPtr, StringPtr, StringPtr, StringPtr, String> t6 =
      tuple(Tuple<StringPtr, StringPtr>(t5), "baz", tuple("qux", heapString("quux")));
  EXPECT_EQ("foo", get<0>(t6));
  EXPECT_EQ("bar", get<1>(t6));
  EXPECT_EQ("baz", get<2>(t6));
  EXPECT_EQ("qux", get<3>(t6));
  EXPECT_EQ("quux", get<4>(t6));

  kj::apply([](Foo a, Bar b, Own<Foo> c, Own<Bar> d, uint e, StringPtr f, StringPtr g) {
    EXPECT_EQ(123u, a.foo);
    EXPECT_EQ(456u, b.bar);
    EXPECT_EQ(123u, c->foo);
    EXPECT_EQ(456u, d->bar);
    EXPECT_EQ(789u, e);
    EXPECT_EQ("foo", f);
    EXPECT_EQ("bar", g);
  }, t, tuple(heap<Foo>(123), heap<Bar>(456)), 789, mv(t5));

  uint i = tuple(123);
  EXPECT_EQ(123u, i);

  i = tuple(tuple(), 456, tuple(tuple(), tuple()));
  EXPECT_EQ(456u, i);

  EXPECT_EQ(0, (indexOfType<int, Tuple<int, char, bool>>()));
  EXPECT_EQ(1, (indexOfType<char, Tuple<int, char, bool>>()));
  EXPECT_EQ(2, (indexOfType<bool, Tuple<int, char, bool>>()));
  EXPECT_EQ(0, (indexOfType<int, int>()));
}